

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

int amqpvalue_get_rejected(AMQP_VALUE value,REJECTED_HANDLE *rejected_handle)

{
  int iVar1;
  AMQP_TYPE AVar2;
  int iVar3;
  REJECTED_HANDLE pRVar4;
  AMQP_VALUE pAVar5;
  uint32_t list_item_count;
  ERROR_HANDLE error;
  uint32_t local_34;
  ERROR_HANDLE local_30;
  
  pRVar4 = (REJECTED_HANDLE)malloc(8);
  if (pRVar4 == (REJECTED_HANDLE)0x0) {
    *rejected_handle = (REJECTED_HANDLE)0x0;
    iVar3 = 0x455e;
  }
  else {
    pRVar4->composite_value = (AMQP_VALUE)0x0;
    *rejected_handle = pRVar4;
    pAVar5 = amqpvalue_get_inplace_described_value(value);
    if (pAVar5 == (AMQP_VALUE)0x0) {
      rejected_destroy(*rejected_handle);
      iVar3 = 0x4566;
    }
    else {
      iVar1 = amqpvalue_get_list_item_count(pAVar5,&local_34);
      iVar3 = 0x456d;
      if (iVar1 == 0) {
        if ((local_34 != 0) &&
           (pAVar5 = amqpvalue_get_list_item(pAVar5,0), pAVar5 != (AMQP_VALUE)0x0)) {
          AVar2 = amqpvalue_get_type(pAVar5);
          if (AVar2 != AMQP_TYPE_NULL) {
            iVar3 = amqpvalue_get_error(pAVar5,&local_30);
            if (iVar3 != 0) {
              amqpvalue_destroy(pAVar5);
              rejected_destroy(*rejected_handle);
              return 0x4589;
            }
            error_destroy(local_30);
          }
          amqpvalue_destroy(pAVar5);
        }
        pAVar5 = amqpvalue_clone(value);
        pRVar4->composite_value = pAVar5;
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int amqpvalue_get_rejected(AMQP_VALUE value, REJECTED_HANDLE* rejected_handle)
{
    int result;
    REJECTED_INSTANCE* rejected_instance = (REJECTED_INSTANCE*)rejected_create_internal();
    *rejected_handle = rejected_instance;
    if (*rejected_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            rejected_destroy(*rejected_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {
                    AMQP_VALUE item_value;
                    /* error */
                    if (list_item_count > 0)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 0);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                ERROR_HANDLE error;
                                if (amqpvalue_get_error(item_value, &error) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    rejected_destroy(*rejected_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                                else
                                {
                                    error_destroy(error);
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }

                    rejected_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}